

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

bool __thiscall QHttp2Connection::serverCheckClientPreface(QHttp2Connection *this)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QArrayData *local_68 [3];
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = true;
  if (this[0x2b1] != (QHttp2Connection)0x1) goto LAB_001e91d8;
  plVar2 = (long *)QMetaObject::cast((QObject *)&QIODevice::staticMetaObject);
  lVar3 = (**(code **)(*plVar2 + 0xa0))(plVar2);
  if (0x17 < lVar3) {
    bVar1 = readClientPreface(this);
    if (bVar1) {
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
          != 0) {
        local_48._0_4_ = 2;
        local_48._4_4_ = 0;
        uStack_40._0_4_ = 0;
        uStack_40._4_4_ = 0;
        uStack_38._0_4_ = 0;
        uStack_38._4_4_ = 0;
        local_30 = qHttp2ConnectionLog::category.name;
        QMessageLogger::debug((char *)&local_48,"[%p] Peer sent valid client preface",this);
      }
      this[0x2b1] = (QHttp2Connection)0x0;
      bVar1 = sendServerPreface(this);
      if (bVar1) goto LAB_001e91d8;
      connectionError(this,INTERNAL_ERROR,"Failed to send server preface");
    }
    else {
      (**(code **)(*plVar2 + 0x70))(plVar2);
      QVar5.m_data = (storage_type *)0x16;
      QVar5.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar5);
      local_68[0] = (QArrayData *)CONCAT44(local_48._4_4_,(undefined4)local_48);
      uStack_40 = &local_4c;
      local_4c = 1;
      local_48._0_4_ = 0;
      local_48._4_4_ = 0;
      uStack_38 = local_68;
      QMetaObject::activate((QObject *)this,&staticMetaObject,6,(void **)&local_48);
      if (local_68[0] != (QArrayData *)0x0) {
        LOCK();
        (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68[0],2,0x10);
        }
      }
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
          != 0) {
        local_48._0_4_ = 2;
        local_48._4_4_ = 0;
        uStack_40._0_4_ = 0;
        uStack_40._4_4_ = 0;
        uStack_38._0_4_ = 0;
        uStack_38._4_4_ = 0;
        local_30 = qHttp2ConnectionLog::category.name;
        bVar4 = false;
        QMessageLogger::debug((char *)&local_48,"[%p] Invalid client preface",this);
        goto LAB_001e91d8;
      }
    }
  }
  bVar4 = false;
LAB_001e91d8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::serverCheckClientPreface()
{
    if (!m_waitingForClientPreface)
        return true;
    auto *socket = getSocket();
    if (socket->bytesAvailable() < Http2::clientPrefaceLength)
        return false;
    if (!readClientPreface()) {
        socket->close();
        emit errorOccurred(Http2Error::PROTOCOL_ERROR, "invalid client preface"_L1);
        qCDebug(qHttp2ConnectionLog, "[%p] Invalid client preface", this);
        return false;
    }
    qCDebug(qHttp2ConnectionLog, "[%p] Peer sent valid client preface", this);
    m_waitingForClientPreface = false;
    if (!sendServerPreface()) {
        connectionError(INTERNAL_ERROR, "Failed to send server preface");
        return false;
    }
    return true;
}